

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

void * sc_core::sc_event_timed::allocate(void)

{
  undefined8 *puVar1;
  sc_event_timed_u *q;
  int i;
  int ALLOC_SIZE;
  int local_8;
  
  if (free_list == (undefined8 *)0x0) {
    free_list = (undefined8 *)malloc(0x400);
    for (local_8 = 0; local_8 < 0x3f; local_8 = local_8 + 1) {
      free_list[(long)local_8 * 2] = free_list + (long)(local_8 + 1) * 2;
    }
    free_list[(long)local_8 * 2] = 0;
  }
  puVar1 = free_list;
  free_list = (undefined8 *)*free_list;
  return puVar1;
}

Assistant:

void*
sc_event_timed::allocate()
{
    const int ALLOC_SIZE = 64;

    if( free_list == 0 ) {
        free_list = (sc_event_timed_u*) malloc( ALLOC_SIZE *
                                                sizeof( sc_event_timed_u ) );
        int i = 0;
        for( ; i < ALLOC_SIZE - 1; ++ i ) {
            free_list[i].next = &free_list[i + 1];
        }
        free_list[i].next = 0;
    }

    sc_event_timed_u* q = free_list;
    free_list = free_list->next;
    return q;
}